

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O3

void __thiscall adios2::IO::SetEngine(IO *this,string *engineType)

{
  IO *pIVar1;
  pointer pcVar2;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pIVar1 = this->m_IO;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"in call to IO::SetEngine","")
  ;
  helper::CheckForNullptr<adios2::core::IO>(pIVar1,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pIVar1 = this->m_IO;
  pcVar2 = (engineType->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + engineType->_M_string_length);
  adios2::core::IO::SetEngine(pIVar1,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

void IO::SetEngine(const std::string engineType)
{
    helper::CheckForNullptr(m_IO, "in call to IO::SetEngine");
    m_IO->SetEngine(engineType);
}